

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basisu_transcoder.h
# Opt level: O0

void __thiscall basist::basisu_transcoder_state::clear(basisu_transcoder_state *this)

{
  uint32_t j;
  uint32_t i;
  uint in_stack_fffffffffffffff0;
  uint uVar1;
  
  for (uVar1 = 0; uVar1 < 2; uVar1 = uVar1 + 1) {
    basisu::vector<basist::basisu_transcoder_state::block_preds>::clear
              ((vector<basist::basisu_transcoder_state::block_preds> *)
               CONCAT44(uVar1,in_stack_fffffffffffffff0));
    for (in_stack_fffffffffffffff0 = 0; in_stack_fffffffffffffff0 < 0x10;
        in_stack_fffffffffffffff0 = in_stack_fffffffffffffff0 + 1) {
      basisu::vector<unsigned_int>::clear
                ((vector<unsigned_int> *)CONCAT44(uVar1,in_stack_fffffffffffffff0));
    }
  }
  return;
}

Assistant:

void clear()
		{
			for (uint32_t i = 0; i < 2; i++)
			{
				m_block_endpoint_preds[i].clear();

				for (uint32_t j = 0; j < cMaxPrevFrameLevels; j++)
					m_prev_frame_indices[i][j].clear();
			}
		}